

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

wchar_t best_effort_strncat_in_locale
                  (archive_string *as,void *_p,size_t length,archive_string_conv *sc)

{
  char c;
  archive_string *paVar1;
  size_t sVar2;
  char *p;
  char *pcVar3;
  wchar_t wVar4;
  mbstate_t_conflict shift_state;
  wchar_t wc;
  mbstate_t local_38;
  wchar_t local_2c;
  
  if (sc->same == L'\0') {
    c = *_p;
    wVar4 = L'\0';
    if (c != '\0' && length != 0) {
      pcVar3 = (char *)((long)_p + 1);
      wVar4 = L'\0';
      do {
        if (c < '\0') {
          if ((sc->flag & L'Ā') == L'\0') {
            wVar4 = L'\xffffffff';
            c = '?';
            goto LAB_004b6541;
          }
          paVar1 = archive_string_append(as,utf8_replacement_char,3);
          wVar4 = L'\xffffffff';
          if (paVar1 == (archive_string *)0x0) {
            __archive_errx(1,"Out of memory");
          }
        }
        else {
LAB_004b6541:
          archive_strappend_char(as,c);
        }
        c = *pcVar3;
        pcVar3 = pcVar3 + 1;
      } while (c != '\0');
    }
  }
  else {
    paVar1 = archive_string_append(as,(char *)_p,length);
    if (paVar1 == (archive_string *)0x0) {
LAB_004b6582:
      wVar4 = L'\xffffffff';
    }
    else {
      local_38.__count = 0;
      local_38.__value = (_union_27)0x0;
      wVar4 = L'\0';
      if (length != 0) {
        do {
          sVar2 = mbrtowc(&local_2c,(char *)_p,length,&local_38);
          if (0xfffffffffffffffd < sVar2) goto LAB_004b6582;
          if (sVar2 == 0) {
            return L'\0';
          }
          _p = (void *)((long)_p + sVar2);
          length = length - sVar2;
          wVar4 = L'\0';
        } while (length != 0);
      }
    }
  }
  return wVar4;
}

Assistant:

static int
best_effort_strncat_in_locale(struct archive_string *as, const void *_p,
    size_t length, struct archive_string_conv *sc)
{
	size_t remaining;
	const uint8_t *itp;
	int return_value = 0; /* success */

	/*
	 * If both from-locale and to-locale is the same, this makes a copy.
	 * And then this checks all copied MBS can be WCS if so returns 0.
	 */
	if (sc->same) {
		if (archive_string_append(as, _p, length) == NULL)
			return (-1);/* No memory */
		return (invalid_mbs(_p, length, sc));
	}

	/*
	 * If a character is ASCII, this just copies it. If not, this
	 * assigns '?' character instead but in UTF-8 locale this assigns
	 * byte sequence 0xEF 0xBD 0xBD, which are code point U+FFFD,
	 * a Replacement Character in Unicode.
	 */

	remaining = length;
	itp = (const uint8_t *)_p;
	while (*itp && remaining > 0) {
		if (*itp > 127) {
			// Non-ASCII: Substitute with suitable replacement
			if (sc->flag & SCONV_TO_UTF8) {
				if (archive_string_append(as, utf8_replacement_char, sizeof(utf8_replacement_char)) == NULL) {
					__archive_errx(1, "Out of memory");
				}
			} else {
				archive_strappend_char(as, '?');
			}
			return_value = -1;
		} else {
			archive_strappend_char(as, *itp);
		}
		++itp;
	}
	return (return_value);
}